

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BasicReporter::EndSection(BasicReporter *this,string *sectionName,Counts *assertions)

{
  pointer pSVar1;
  pointer pcVar2;
  ostream *poVar3;
  char *pcVar4;
  string *this_00;
  Colour colour;
  allocator local_6a;
  allocator local_69;
  string local_68;
  undefined1 local_48 [40];
  
  pSVar1 = (this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar1[-1].emitted == true) && (pSVar1[-1].name._M_string_length != 0)) {
    poVar3 = std::operator<<((this->m_config).m_stream,"[End of section: \'");
    poVar3 = std::operator<<(poVar3,(string *)sectionName);
    std::operator<<(poVar3,"\' ");
    if (assertions->failed == 0) {
      Colour::Colour(&colour,BrightGreen);
      pcVar4 = "";
      if (1 < assertions->passed) {
        pcVar4 = "All ";
      }
      poVar3 = std::operator<<((this->m_config).m_stream,pcVar4);
      pcVar2 = (pointer)assertions->passed;
      std::__cxx11::string::string((string *)&local_68,"assertion",&local_6a);
      local_48._0_8_ = pcVar2;
      std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_68);
      poVar3 = operator<<(poVar3,(pluralise *)local_48);
      std::operator<<(poVar3," passed");
      std::__cxx11::string::~string((string *)(local_48 + 8));
      this_00 = &local_68;
    }
    else {
      Colour::Colour(&colour,BrightRed);
      std::__cxx11::string::string((string *)local_48,"assertion",&local_6a);
      std::__cxx11::string::string((string *)&local_68,"All ",&local_69);
      ReportCounts(this,(string *)local_48,assertions,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      this_00 = (string *)local_48;
    }
    std::__cxx11::string::~string((string *)this_00);
    Colour::~Colour(&colour);
    poVar3 = std::operator<<((this->m_config).m_stream,"]\n");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  pop_back(&this->m_sectionSpans);
  return;
}

Assistant:

virtual void EndSection( const std::string& sectionName, const Counts& assertions ) {

            SpanInfo& sectionSpan = m_sectionSpans.back();
            if( sectionSpan.emitted && !sectionSpan.name.empty() ) {
                m_config.stream() << "[End of section: '" << sectionName << "' ";

                if( assertions.failed ) {
                    Colour colour( Colour::ResultError );
                    ReportCounts( "assertion", assertions);
                }
                else {
                    Colour colour( Colour::ResultSuccess );
                    m_config.stream()   << ( assertions.passed > 1 ? "All " : "" )
                                        << pluralise( assertions.passed, "assertion" ) << " passed" ;
                }
                m_config.stream() << "]\n" << std::endl;
            }
            m_sectionSpans.pop_back();
        }